

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

sample_type __thiscall
charls::jls_codec<charls::lossless_traits<unsigned_short,_12>,_charls::decoder_strategy>::
decode_run_interruption_pixel
          (jls_codec<charls::lossless_traits<unsigned_short,_12>,_charls::decoder_strategy> *this,
          int32_t ra,int32_t rb)

{
  uint uVar1;
  int32_t iVar2;
  int iVar3;
  reference pvVar4;
  uchar *tbs;
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  size_t in_R8;
  int32_t error_value;
  int32_t error_value_1;
  int32_t rb_local;
  int32_t ra_local;
  jls_codec<charls::lossless_traits<unsigned_short,_12>,_charls::decoder_strategy> *this_local;
  
  uVar1 = ra - rb;
  tbs = (uchar *)(ulong)-uVar1;
  if ((int)uVar1 < 1) {
    uVar1 = -uVar1;
  }
  if ((int)uVar1 < 1) {
    pvVar4 = std::array<charls::context_run_mode,_2UL>::operator[](&this->context_run_mode_,1);
    iVar2 = decode_run_interruption_error(this,pvVar4);
    this_local._6_2_ =
         lossless_traits_impl<unsigned_short,_12>::compute_reconstructed_sample(ra,iVar2);
  }
  else {
    pvVar4 = std::array<charls::context_run_mode,_2UL>::operator[](&this->context_run_mode_,0);
    iVar2 = decode_run_interruption_error(this,pvVar4);
    iVar3 = charls::sign((EVP_PKEY_CTX *)(ulong)(uint)(rb - ra),(uchar *)pvVar4,
                         (size_t *)CONCAT44(extraout_var,extraout_EDX),tbs,in_R8);
    this_local._6_2_ =
         lossless_traits_impl<unsigned_short,_12>::compute_reconstructed_sample(rb,iVar2 * iVar3);
  }
  return this_local._6_2_;
}

Assistant:

sample_type decode_run_interruption_pixel(int32_t ra, int32_t rb)
    {
        if (std::abs(ra - rb) <= traits_.near_lossless)
        {
            const int32_t error_value{decode_run_interruption_error(context_run_mode_[1])};
            return static_cast<sample_type>(traits_.compute_reconstructed_sample(ra, error_value));
        }

        const int32_t error_value{decode_run_interruption_error(context_run_mode_[0])};
        return static_cast<sample_type>(traits_.compute_reconstructed_sample(rb, error_value * sign(rb - ra)));
    }